

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

expected<const_Command_*,_Commands::MatchFailure> * __thiscall
Commands::match(expected<const_Command_*,_Commands::MatchFailure> *__return_storage_ptr__,
               Commands *this,Alternator *alternator,optional<const_SyntaxTree_&> *cmdnode,
               MatchArgumentList *args,SymTable *symtable,shared_ptr<Scope> *scope_ptr,
               Options *options)

{
  char cVar1;
  pointer ppCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppCVar3;
  bool bVar4;
  optional<const_SyntaxTree_&> local_50;
  value_type local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  undefined4 local_38;
  
  ppCVar3 = (alternator->super__Vector_base<const_Command_*,_std::allocator<const_Command_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (alternator->super__Vector_base<const_Command_*,_std::allocator<const_Command_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = ppCVar3 == ppCVar2;
  if (!bVar4) {
    local_50 = (optional<const_SyntaxTree_&>)cmdnode->ref;
    match(__return_storage_ptr__,this,*ppCVar3,&local_50,args,symtable,scope_ptr,options);
    cVar1 = __return_storage_ptr__->has_value;
    while (cVar1 == '\0') {
      ppCVar3 = ppCVar3 + 1;
      this_00 = (__return_storage_ptr__->contained).m_error.context.
                super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      bVar4 = ppCVar3 == ppCVar2;
      if (bVar4) goto LAB_00163a9c;
      local_50 = (optional<const_SyntaxTree_&>)cmdnode->ref;
      match(__return_storage_ptr__,this,*ppCVar3,&local_50,args,symtable,scope_ptr,options);
      cVar1 = __return_storage_ptr__->has_value;
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
  }
LAB_00163a9c:
  if (cmdnode->ref == (SyntaxTree *)0x0) {
    local_48 = (value_type)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::__shared_ptr<SyntaxTree_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
              ((__shared_ptr<SyntaxTree_const,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)cmdnode->ref);
  }
  local_38 = 2;
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_40->_M_use_count = p_Stack_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_40->_M_use_count = p_Stack_40->_M_use_count + 1;
    }
  }
  __return_storage_ptr__->has_value = false;
  (__return_storage_ptr__->contained).m_value = local_48;
  (__return_storage_ptr__->contained).m_error.context.
  super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_40;
  (__return_storage_ptr__->contained).m_error.reason = NoAlternativeMatch;
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Commands::match(const Alternator& alternator, optional<const SyntaxTree&> cmdnode, const MatchArgumentList& args,
                     const SymTable& symtable, const shared_ptr<Scope>& scope_ptr, const Options& options) const
                                                                                                -> expected<const Command*, MatchFailure>
{
    for(auto& cmd : alternator)
    {
        if(auto opt_command = this->match(*cmd, cmdnode, args, symtable, scope_ptr, options))
            return opt_command;
    }
    return make_unexpected(MatchFailure { hint_from(cmdnode), MatchFailure::NoAlternativeMatch });
}